

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corner_table.h
# Opt level: O2

CornerIndex __thiscall draco::CornerTable::GetLeftCorner(CornerTable *this,CornerIndex corner_id)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if (corner_id.value_ != 0xffffffff) {
    if (corner_id.value_ % 3 == 0) {
      uVar1 = corner_id.value_ + 2;
      if (uVar1 == 0xffffffff) {
        return (CornerIndex)0xffffffff;
      }
    }
    else {
      uVar1 = corner_id.value_ - 1;
    }
    uVar1 = (this->opposite_corners_).vector_.
            super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar1].value_;
  }
  return (CornerIndex)uVar1;
}

Assistant:

inline CornerIndex GetLeftCorner(CornerIndex corner_id) const {
    if (corner_id == kInvalidCornerIndex) {
      return kInvalidCornerIndex;
    }
    return Opposite(Previous(corner_id));
  }